

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tank.cpp
# Opt level: O1

bool __thiscall Tank::createServer(Tank *this)

{
  __fd_mask *p_Var1;
  addrinfo *paVar2;
  uint __val;
  uint uVar3;
  int iVar4;
  int *piVar5;
  ostream *poVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  uint uVar12;
  uint __len;
  bool bVar13;
  string __str;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar12 = this->vector_order + 10000;
  __val = -uVar12;
  if (0 < (int)uVar12) {
    __val = uVar12;
  }
  __len = 1;
  if (9 < __val) {
    uVar9 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_00106b20;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_00106b20;
      }
      if (uVar7 < 10000) goto LAB_00106b20;
      uVar9 = uVar9 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_00106b20:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)((int)uVar12 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + (uVar12 >> 0x1f),__len,__val);
  std::__cxx11::string::operator=((string *)&this->myPort,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  (this->myhints).ai_flags = 0;
  (this->myhints).ai_family = 0;
  (this->myhints).ai_socktype = 0;
  (this->myhints).ai_protocol = 0;
  (this->myhints).ai_canonname = (char *)0x0;
  (this->myhints).ai_next = (addrinfo *)0x0;
  *(undefined8 *)&(this->myhints).ai_addrlen = 0;
  (this->myhints).ai_addr = (sockaddr *)0x0;
  (this->myhints).ai_socktype = 1;
  (this->myhints).ai_flags = 1;
  (this->myhints).ai_family = 2;
  (this->master).fds_bits[0] = 0;
  (this->master).fds_bits[1] = 0;
  (this->master).fds_bits[2] = 0;
  (this->master).fds_bits[3] = 0;
  (this->master).fds_bits[4] = 0;
  (this->master).fds_bits[5] = 0;
  (this->master).fds_bits[6] = 0;
  (this->master).fds_bits[7] = 0;
  (this->master).fds_bits[8] = 0;
  (this->master).fds_bits[9] = 0;
  (this->master).fds_bits[10] = 0;
  (this->master).fds_bits[0xb] = 0;
  (this->master).fds_bits[0xc] = 0;
  (this->master).fds_bits[0xd] = 0;
  (this->master).fds_bits[0xe] = 0;
  (this->master).fds_bits[0xf] = 0;
  (this->tmpSet).fds_bits[0] = 0;
  (this->tmpSet).fds_bits[1] = 0;
  (this->tmpSet).fds_bits[2] = 0;
  (this->tmpSet).fds_bits[3] = 0;
  (this->tmpSet).fds_bits[4] = 0;
  (this->tmpSet).fds_bits[5] = 0;
  (this->tmpSet).fds_bits[6] = 0;
  (this->tmpSet).fds_bits[7] = 0;
  (this->tmpSet).fds_bits[8] = 0;
  (this->tmpSet).fds_bits[9] = 0;
  (this->tmpSet).fds_bits[10] = 0;
  (this->tmpSet).fds_bits[0xb] = 0;
  (this->tmpSet).fds_bits[0xc] = 0;
  (this->tmpSet).fds_bits[0xd] = 0;
  (this->tmpSet).fds_bits[0xe] = 0;
  (this->tmpSet).fds_bits[0xf] = 0;
  iVar4 = getaddrinfo((char *)0x0,(this->myPort)._M_dataplus._M_p,(addrinfo *)&this->myhints,
                      (addrinfo **)&this->myaddr);
  if (iVar4 == 0) {
    paVar2 = this->myaddr;
    iVar4 = socket(paVar2->ai_family,paVar2->ai_socktype,paVar2->ai_protocol);
    this->listener = iVar4;
    if (iVar4 == -1) {
      printf("Cannot create new socket%s\n",(this->myPort)._M_dataplus._M_p);
      return false;
    }
    this->fdMax = iVar4;
    iVar8 = iVar4 + 0x3f;
    if (-1 < iVar4) {
      iVar8 = iVar4;
    }
    p_Var1 = (this->master).fds_bits + (iVar8 >> 6);
    *p_Var1 = *p_Var1 | 1L << ((byte)iVar4 & 0x3f);
    iVar4 = bind(iVar4,(sockaddr *)this->myaddr->ai_addr,this->myaddr->ai_addrlen);
    if (iVar4 == 0) {
      iVar4 = listen(this->listener,0xf);
      if (iVar4 != 0) {
        printf("Cannot listen on socket");
        piVar5 = __errno_location();
        iVar4 = *piVar5;
        if (iVar4 < 0x5f) {
          if (iVar4 == 9) {
            pcVar11 = "bad descriptor";
            lVar10 = 0xe;
          }
          else {
            if (iVar4 != 0x58) goto LAB_00106d5a;
            pcVar11 = "not a socket";
            lVar10 = 0xc;
          }
        }
        else if (iVar4 == 0x5f) {
          pcVar11 = "not a supported type";
          lVar10 = 0x14;
        }
        else {
          if (iVar4 != 0x62) goto LAB_00106d5a;
          pcVar11 = "Address is in use";
          lVar10 = 0x11;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,lVar10);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        return false;
      }
LAB_00106d5a:
      freeaddrinfo((addrinfo *)this->myaddr);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TANK: ",6);
      bVar13 = this->color != RED;
      pcVar11 = "GREEN_";
      if (!bVar13) {
        pcVar11 = "RED_";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,pcVar11,(ulong)bVar13 * 2 + 4);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->vector_order);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," Spawned and listening on ",0x1a);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(this->myPort)._M_dataplus._M_p,(this->myPort)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      this->fdMax = this->listener;
      return true;
    }
    pcVar11 = "Cannot bind socket to address";
  }
  else {
    pcVar11 = "Cannot get server IP address";
  }
  puts(pcVar11);
  return false;
}

Assistant:

bool Tank::createServer()
{

        int myPortInt = 10000;
        myPortInt += this->vector_order; // + order in vector of tanks in world
        myPort = std::to_string(myPortInt);

        memset(&myhints, 0, sizeof(struct addrinfo));
        myhints.ai_socktype = SOCK_STREAM;
        myhints.ai_family = AF_INET;
        myhints.ai_flags = AI_PASSIVE;

        FD_ZERO(&master);
        FD_ZERO (&tmpSet);

        if (getaddrinfo(NULL, myPort.c_str(), &myhints, &myaddr) != 0) {
            printf("Cannot get server IP address\n");
            return false;
        }

        // Create listener socket
        listener = socket(myaddr->ai_family, myaddr->ai_socktype, myaddr->ai_protocol);
        if (listener == -1) {
            printf("Cannot create new socket%s\n", myPort.c_str());
            return false;
        }

        fdMax = listener;
        FD_SET(listener, &master);

        if (bind(listener, myaddr->ai_addr, myaddr->ai_addrlen) != 0) {
                printf("Cannot bind socket to address\n");
                return false;
            }


        if (listen(listener, 15) != 0) {
           printf("Cannot listen on socket");
	   switch(errno){
        	case EADDRINUSE:
            		std::cerr << "Address is in use" << std::endl;
            		return false;
       	 	case EBADF:
            		std::cerr << "bad descriptor" << std::endl;
            		return false;
        	case ENOTSOCK:
            		std::cerr << "not a socket" << std::endl;
            		return false;
        	case EOPNOTSUPP:
            		std::cerr << "not a supported type" << std::endl;
		        return false;
        	}
        }

        freeaddrinfo(myaddr);
        std::cout << "TANK: " << (this->color == RED ? "RED_" : "GREEN_") << vector_order << " Spawned and listening on " << myPort << std::endl;
        fdMax = listener;
        return true;
}